

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O2

void cfl_luma_subsampling_444_lbd_c
               (uint8_t *input,int input_stride,uint16_t *output_q3,int width,int height)

{
  int iVar1;
  ulong uVar2;
  int i;
  ulong uVar3;
  
  uVar2 = (ulong)(uint)width;
  if (width < 1) {
    uVar2 = 0;
  }
  iVar1 = 0;
  if (height < 1) {
    height = 0;
    iVar1 = 0;
  }
  for (; iVar1 != height; iVar1 = iVar1 + 1) {
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      output_q3[uVar3] = (ushort)input[uVar3] << 3;
    }
    input = input + input_stride;
    output_q3 = output_q3 + 0x20;
  }
  return;
}

Assistant:

static void cfl_luma_subsampling_444_lbd_c(const uint8_t *input,
                                           int input_stride,
                                           uint16_t *output_q3, int width,
                                           int height) {
  assert((height - 1) * CFL_BUF_LINE + width <= CFL_BUF_SQUARE);
  for (int j = 0; j < height; j++) {
    for (int i = 0; i < width; i++) {
      output_q3[i] = input[i] << 3;
    }
    input += input_stride;
    output_q3 += CFL_BUF_LINE;
  }
}